

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

char * jsonnet_evaluate_file_aux(JsonnetVm *vm,char *filename,int *error,EvalKind kind)

{
  byte bVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  undefined4 *in_RDX;
  char *in_RSI;
  JsonnetVm *in_RDI;
  string input;
  stringstream ss;
  EvalKind in_stack_0000019c;
  int *in_stack_000001a0;
  char *in_stack_000001a8;
  char *in_stack_000001b0;
  JsonnetVm *in_stack_000001b8;
  ifstream f;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffb80;
  istream_type *in_stack_fffffffffffffb88;
  istreambuf_iterator<char,_std::char_traits<char>_> *this;
  string *in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffbd8;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffbe8;
  string local_3e8 [32];
  stringstream local_3c8 [16];
  ostream local_3b8 [392];
  undefined1 local_230 [528];
  undefined4 *local_20;
  char *local_18;
  JsonnetVm *local_10;
  char *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::ifstream::ifstream(local_230);
  std::ifstream::open(local_230,local_18,8);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_3c8);
    poVar2 = std::operator<<(local_3b8,"Opening input file: ");
    poVar2 = std::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,": ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    *local_20 = 1;
    std::__cxx11::stringstream::str();
    local_8 = from_string(local_10,in_stack_fffffffffffffb98);
    std::__cxx11::string::~string(local_3e8);
    std::__cxx11::stringstream::~stringstream(local_3c8);
  }
  else {
    this = (istreambuf_iterator<char,_std::char_traits<char>_> *)&stack0xfffffffffffffbf0;
    std::__cxx11::string::string((string *)this);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (this,in_stack_fffffffffffffb88);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (in_stack_fffffffffffffb80);
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbd8);
    std::__cxx11::string::c_str();
    local_8 = jsonnet_evaluate_snippet_aux
                        (in_stack_000001b8,in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,
                         in_stack_0000019c);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbf0);
  }
  std::ifstream::~ifstream(local_230);
  return local_8;
}

Assistant:

static char *jsonnet_evaluate_file_aux(JsonnetVm *vm, const char *filename, int *error,
                                       EvalKind kind)
{
    std::ifstream f;
    f.open(filename);
    if (!f.good()) {
        std::stringstream ss;
        ss << "Opening input file: " << filename << ": " << strerror(errno);
        *error = true;
        return from_string(vm, ss.str());
    }
    std::string input;
    input.assign(std::istreambuf_iterator<char>(f), std::istreambuf_iterator<char>());

    return jsonnet_evaluate_snippet_aux(vm, filename, input.c_str(), error, kind);
}